

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_reduce(secp256k1_scalar *r,uint overflow)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint128_t t;
  uint overflow_local;
  secp256k1_scalar *r_local;
  
  uVar1 = (ulong)CARRY8(r->d[0],(ulong)overflow * 0x402da1732fc9bebf);
  r->d[0] = r->d[0] + (ulong)overflow * 0x402da1732fc9bebf;
  uVar3 = r->d[1] + (ulong)overflow * 0x4551231950b75fc4;
  uVar2 = (ulong)CARRY8(r->d[1],(ulong)overflow * 0x4551231950b75fc4) + (ulong)CARRY8(uVar1,uVar3);
  r->d[1] = uVar1 + uVar3;
  uVar1 = r->d[2];
  uVar3 = uVar1 + overflow;
  r->d[2] = uVar2 + uVar3;
  r->d[3] = (ulong)CARRY8(uVar1,(ulong)overflow) + (ulong)CARRY8(uVar2,uVar3) + r->d[3];
  return overflow;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_reduce(secp256k1_scalar *r, unsigned int overflow) {
    uint128_t t;
    VERIFY_CHECK(overflow <= 1);
    t = (uint128_t)r->d[0] + overflow * SECP256K1_N_C_0;
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[1] + overflow * SECP256K1_N_C_1;
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[2] + overflow * SECP256K1_N_C_2;
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint64_t)r->d[3];
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL;
    return overflow;
}